

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O3

boolean test_move(int ux,int uy,int dx,int dy,int dz,int mode)

{
  char cVar1;
  level *plVar2;
  boolean bVar3;
  char cVar4;
  byte bVar5;
  schar sVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  trap *ptVar10;
  obj *poVar11;
  obj *poVar12;
  char *pcVar13;
  char *pcVar14;
  char cVar15;
  undefined4 in_register_0000000c;
  int iVar16;
  undefined4 in_register_00000014;
  int iVar17;
  char *pcVar18;
  long lVar19;
  byte x;
  monst *worm;
  xchar x_00;
  byte y;
  long lVar20;
  bool bVar21;
  bool bVar22;
  xchar local_b8;
  xchar local_b0;
  d_level local_a2;
  undefined8 local_a0;
  undefined8 local_98;
  ulong local_90;
  d_level *local_88;
  char *local_80;
  trap *local_78;
  int local_70;
  int local_6c;
  long local_68;
  char *local_60;
  char *local_58;
  long local_50;
  d_level *local_48;
  d_level *local_40;
  long local_38;
  
  plVar2 = level;
  local_a0 = CONCAT44(in_register_00000014,dx);
  local_98 = CONCAT44(in_register_0000000c,dy);
  iVar16 = dx + ux;
  iVar17 = dy + uy;
  lVar20 = (long)iVar16;
  local_90 = lVar20 * 0xfc;
  lVar19 = (long)iVar17;
  local_88 = (d_level *)(lVar19 * 3);
  cVar4 = level->locations[lVar20][lVar19].typ;
  cVar15 = (char)iVar17;
  x_00 = (xchar)iVar16;
  if ('\x10' < cVar4 && cVar4 != '\x16') {
    if (cVar4 != '\x17') goto LAB_001a3940;
    bVar3 = closed_door(level,iVar16,iVar17);
    if (bVar3 != '\0') {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a3450;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a3447;
      }
      else {
LAB_001a3447:
        if (ublindf == (obj *)0x0) {
          if (mode != 0) goto LAB_001a3717;
        }
        else {
LAB_001a3450:
          if ((mode != 0) || (ublindf->oartifact == '\x1d')) goto LAB_001a3717;
        }
        feel_location(x_00,cVar15);
      }
LAB_001a3717:
      iVar7 = artifact_door(level,iVar16,iVar17);
      if (iVar7 != 0) {
        if (mode != 0) {
          return '\0';
        }
        uVar9 = (youmonst.data)->mflags1;
        if ((uVar9 & 4) != 0) {
          pcVar18 = "You try to ooze under the door, but the gap is too small.";
          goto LAB_001a3a2c;
        }
        if ((uVar9 & 0x60) == 0x20) {
          pcVar18 = "You hurt your teeth on the reinforced door.";
          goto LAB_001a3a2c;
        }
        if ((int)local_a0 != 0 && (int)local_98 != 0) {
          return '\0';
        }
        if (u.uprops[0x1e].intrinsic == 0) {
          if (ublindf == (obj *)0x0) {
            if ((uVar9 & 0x1000) == 0 && u.uprops[0x1b].intrinsic == 0) goto LAB_001a49f4;
          }
          else {
            if (((uVar9 >> 0xc & 1) != 0) || (ublindf->otyp != 0xed)) goto LAB_001a3839;
LAB_001a49e7:
            if (u.uprops[0x1b].intrinsic == 0) {
LAB_001a49f4:
              if ((((u.umonnum != 0x9e) && ((youmonst.data)->mlet != '\x1c')) &&
                  (sVar6 = acurr(3), '\t' < sVar6)) &&
                 ((u.uprops[0x25].intrinsic == 0 && (u.uprops[0x25].extrinsic == 0)))) {
LAB_001a4a3a:
                pcVar18 = "That door is closed.";
                goto LAB_001a3a2c;
              }
            }
          }
        }
        else if (ublindf != (obj *)0x0) {
LAB_001a3839:
          if (ublindf->oartifact == '\x1d') goto LAB_001a49e7;
        }
        pcVar18 = "Ouch!  You bump into a heavy door.";
LAB_001a4bab:
        pline(pcVar18);
        exercise(3,'\0');
        return '\0';
      }
      if ((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
         (((youmonst.data)->mflags1 & 8) == 0)) {
        bVar3 = can_ooze(&youmonst);
        if (bVar3 == '\0') {
          uVar9 = (youmonst.data)->mflags1;
          if ((uVar9 & 0x60) != 0x20) {
            if (mode != 0) {
              if ((mode & 0xfffffffeU) != 2) {
                return '\0';
              }
              goto LAB_001a387a;
            }
            if ((uVar9 & 4) != 0) {
              pcVar18 = 
              "You try to ooze under the door, but can\'t squeeze your possessions through.";
              goto LAB_001a3a2c;
            }
            if ((int)local_a0 != 0 && (int)local_98 != 0) {
              return '\0';
            }
            if (u.uprops[0x1e].intrinsic == 0) {
              if (ublindf == (obj *)0x0) {
                if ((uVar9 & 0x1000) == 0 && u.uprops[0x1b].intrinsic == 0) goto LAB_001a4d2e;
              }
              else {
                if (((uVar9 >> 0xc & 1) != 0) || (ublindf->otyp != 0xed)) goto LAB_001a4b83;
LAB_001a4d21:
                if (u.uprops[0x1b].intrinsic == 0) {
LAB_001a4d2e:
                  if ((((u.umonnum != 0x9e) && ((youmonst.data)->mlet != '\x1c')) &&
                      (sVar6 = acurr(3), '\t' < sVar6)) &&
                     ((u.uprops[0x25].intrinsic == 0 && (u.uprops[0x25].extrinsic == 0))))
                  goto LAB_001a4a3a;
                }
              }
            }
            else if (ublindf != (obj *)0x0) {
LAB_001a4b83:
              if (ublindf->oartifact == '\x1d') goto LAB_001a4d21;
            }
            if (u.usteed != (monst *)0x0) {
              pcVar18 = y_monnam(u.usteed);
              pcVar13 = "You can\'t lead %s through that closed door.";
LAB_001a4921:
              pline(pcVar13,pcVar18);
              return '\0';
            }
            pcVar18 = "Ouch!  You bump into a door.";
            goto LAB_001a4bab;
          }
          goto LAB_001a3585;
        }
        if (mode == 0) {
          pline("You ooze under the door.");
        }
      }
      goto LAB_001a3940;
    }
LAB_001a387a:
    if (((((int)local_a0 == 0) || ((int)local_98 == 0)) ||
        ((u.uprops[0x3e].intrinsic != 0 ||
         ((u.uprops[0x3e].extrinsic != 0 || (((youmonst.data)->mflags1 & 8) != 0)))))) ||
       (((*(ushort *)&plVar2->locations[lVar20][lVar19].field_0x6 & 0x1e0) == 0 &&
        ((bVar3 = on_level(&u.uz,&dungeon_topology.d_rogue_level), bVar3 == '\0' &&
         (bVar3 = block_door(x_00,cVar15), bVar3 == '\0')))))) goto LAB_001a3940;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
        if (((youmonst.data)->mflags1 & 0x1000) == 0) {
          return '\0';
        }
        goto LAB_001a391d;
      }
    }
    else {
LAB_001a391d:
      if (ublindf == (obj *)0x0) {
        if (mode != 0) {
          return '\0';
        }
        goto LAB_001a3bd5;
      }
    }
    if (mode != 0) {
      return '\0';
    }
    if (ublindf->oartifact == '\x1d') {
      return '\0';
    }
LAB_001a3bd5:
    feel_location(x_00,cVar15);
    return '\0';
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a33e6;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a33dd;
  }
  else {
LAB_001a33dd:
    if (ublindf == (obj *)0x0) {
      if (mode != 0) goto LAB_001a34a8;
    }
    else {
LAB_001a33e6:
      if ((mode != 0) || (ublindf->oartifact == '\x1d')) goto LAB_001a34a8;
    }
    feel_location(x_00,cVar15);
  }
LAB_001a34a8:
  if (((u.uprops[0x3e].intrinsic == 0 && u.uprops[0x3e].extrinsic == 0) &&
      (((youmonst.data)->mflags1 & 8) == 0)) ||
     ((level->locations[x_00][cVar15].typ < '\x0f' &&
      ((level->locations[x_00][cVar15].field_0x7 & 1) != 0)))) {
    if (plVar2->locations[lVar20][lVar19].typ == '\x16') {
      if ((((mode == 0) && (flags.nopick == '\0')) && ((int)(youmonst.data)->mflags1 < 0)) &&
         (iVar7 = still_chewing(x_00,cVar15), iVar7 != 0)) {
        return '\0';
      }
      if (((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
          (((youmonst.data)->mflags1 & 8) == 0)) &&
         (bVar3 = passes_bars(youmonst.data), bVar3 == '\0')) {
        return '\0';
      }
    }
    else {
      if (((youmonst.data)->mflags1 & 0x60) != 0x20) {
        if ((((uwep != (obj *)0x0 && flags.autodig != '\0') &&
              (flags.nopick == '\0' && flags.run == 0)) && ((byte)(uwep->oclass | 4U) == 6)) &&
           (objects[uwep->otyp].oc_subtyp == '\x04')) {
          if (mode != 0) {
            return '\0';
          }
          use_pick_axe2(uwep,(schar)local_a0,(schar)local_98,(schar)dz);
          return '\0';
        }
        if (mode != 0) {
          return '\0';
        }
        bVar3 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
        if ((bVar3 != '\0') && (bVar3 = is_db_wall(iVar16,iVar17), bVar3 != '\0')) {
          pline("The drawbridge is up!");
        }
        if ((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
           (((youmonst.data)->mflags1 & 8) == 0)) {
          return '\0';
        }
        if ('\x0e' < level->locations[x_00][cVar15].typ) {
          return '\0';
        }
        if ((level->locations[x_00][cVar15].field_0x7 & 1) == 0) {
          return '\0';
        }
        if (u.uz.dnum != dungeon_topology.d_sokoban_dnum) {
          return '\0';
        }
        pcVar18 = "The Sokoban walls resist your ability.";
        goto LAB_001a3a2c;
      }
LAB_001a3585:
      if ((mode == 0) && (iVar7 = still_chewing(x_00,cVar15), iVar7 != 0)) {
        return '\0';
      }
    }
  }
LAB_001a3940:
  bVar21 = (int)local_a0 != 0;
  bVar22 = (int)local_98 != 0;
  if (bVar22 && bVar21) {
    local_b0 = (xchar)ux;
    bVar3 = bad_rock(youmonst.data,'\x01',local_b0,cVar15);
    if (bVar3 != '\0') {
      local_b8 = (xchar)uy;
      bVar3 = bad_rock(youmonst.data,'\x01',x_00,local_b8);
      if (bVar3 != '\0') {
        if (u.uz.dnum == dungeon_topology.d_sokoban_dnum) {
          if (mode != 0) {
            return '\0';
          }
          pcVar18 = "You cannot pass that way.";
LAB_001a3a2c:
          pline(pcVar18);
          return '\0';
        }
        if (2 < (youmonst.data)->msize) {
          if (mode != 0) {
            return '\0';
          }
          pcVar18 = "Your body is too large to fit through.";
          goto LAB_001a3a2c;
        }
        if (invent != (obj *)0x0) {
          iVar7 = inv_weight();
          iVar8 = weight_cap();
          if (600 < iVar8 + iVar7) {
            if (mode != 0) {
              return '\0';
            }
            pcVar18 = "You are carrying too much to get through.";
            goto LAB_001a3a2c;
          }
        }
      }
    }
  }
  if ((flags.run == 8) && ((iVar16 != u.ux || (iVar17 != u.uy)))) {
    ptVar10 = t_at(level,iVar16,iVar17);
    if ((ptVar10 != (trap *)0x0) && ((ptVar10->field_0x8 & 0x20) != 0)) {
LAB_001a3c4e:
      if (mode != 0) goto LAB_001a3c53;
      bVar3 = is_pool(level,iVar16,iVar17);
      if (bVar3 == '\0') {
        bVar3 = is_lava(level,iVar16,iVar17);
        if (bVar3 != '\0') {
          pcVar18 = "a pool of lava";
          goto LAB_001a3cb3;
        }
        bVar3 = is_swamp(level,iVar16,iVar17);
        if (bVar3 != '\0') {
          pcVar18 = "a muddy swamp";
          goto LAB_001a3cb3;
        }
      }
      else {
        pcVar18 = "a body of water";
LAB_001a3cb3:
        autoexplore_msg(pcVar18);
      }
      if (flags.travel != '\0') {
        return '\0';
      }
LAB_001a3c53:
      return mode == 3 || mode == 0;
    }
    if ((((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
         ((youmonst.data)->mlet != '\x05')) && (u.uprops[0x3c].extrinsic == 0)) &&
       (uVar9 = (youmonst.data)->mflags1, (uVar9 & 1) == 0)) {
      if (u.usteed == (monst *)0x0) {
        if ((uVar9 & 0x10) == 0) goto LAB_001a3bf0;
      }
      else if ((uVar9 & 0x10) == 0 && ((u.usteed)->data->mflags1 & 1) == 0) {
LAB_001a3bf0:
        bVar3 = is_pool(level,iVar16,iVar17);
        if ((((bVar3 != '\0') || (bVar3 = is_lava(level,iVar16,iVar17), bVar3 != '\0')) ||
            (bVar3 = is_swamp(level,iVar16,iVar17), bVar3 != '\0')) &&
           ((&level->locations[0][0].seenv)[(long)local_88 * 4 + local_90] != '\0'))
        goto LAB_001a3c4e;
      }
    }
  }
  if (mode == 3) {
    return '\0';
  }
  if ((((bVar22 && bVar21) && u.uprops[0x3e].intrinsic == 0) && (u.uprops[0x3e].extrinsic == 0)) &&
     (((youmonst.data)->mflags1 & 8) == 0)) {
    if ((level->locations[ux][uy].typ == '\x17') &&
       ((((*(ushort *)&level->locations[ux][uy].field_0x6 & 0x1e0) != 0 ||
         (bVar3 = on_level(&u.uz,&dungeon_topology.d_rogue_level), bVar3 != '\0')) ||
        (bVar3 = block_entry(x_00,cVar15), bVar3 != '\0')))) {
      if (mode != 0) {
        return '\0';
      }
      pcVar18 = "the doorway";
      goto LAB_001a3dec;
    }
  }
  poVar11 = sobj_at(0x214,level,iVar16,iVar17);
  if (poVar11 == (obj *)0x0) {
    return '\x01';
  }
  if (u.uz.dnum != dungeon_topology.d_sokoban_dnum) {
    if (u.uprops[0x3e].extrinsic != 0 || u.uprops[0x3e].intrinsic != 0) {
      return '\x01';
    }
    if (((youmonst.data)->mflags1 & 8) != 0) {
      return '\x01';
    }
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a3d17;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a3d0e;
  }
  else {
LAB_001a3d0e:
    if (ublindf == (obj *)0x0) goto LAB_001a3df6;
LAB_001a3d17:
    if (ublindf->oartifact != '\x1d') goto LAB_001a3df6;
  }
  if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
    if (mode == 2) goto LAB_001a3df6;
  }
  else if (((u.umonnum == u.umonster) || (bVar3 = dmgtype(youmonst.data,0x24), mode == 2)) ||
          (bVar3 == '\0')) goto LAB_001a3df6;
  if (1 < flags.run) {
    poVar11 = sobj_at(0x214,level,iVar16,iVar17);
    if (mode != 0) {
      return '\0';
    }
    if (poVar11 == (obj *)0x0) {
      return '\0';
    }
    pcVar18 = "a boulder";
LAB_001a3dec:
    autoexplore_msg(pcVar18);
    return '\0';
  }
LAB_001a3df6:
  if (mode == 2) {
    if (u.uz.dnum == dungeon_topology.d_sokoban_dnum) {
      return '\0';
    }
    poVar11 = sobj_at(0x214,level,ux,uy);
    if ((((poVar11 != (obj *)0x0) && (u.uz.dnum != dungeon_topology.d_sokoban_dnum)) &&
        ((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0 &&
         ((((youmonst.data)->mflags1 & 0x60) != 0x20 &&
           (char)(((youmonst.data)->mflags1 & 8) >> 3) == '\0' &&
          (poVar11 = carrying(0x108), poVar11 == (obj *)0x0)))))) &&
       (poVar11 = carrying(0x33), poVar11 == (obj *)0x0)) {
      poVar11 = carrying(0x1cf);
      if (poVar11 == (obj *)0x0) {
        return '\0';
      }
      if ((objects[poVar11->otyp].field_0x10 & 1) != 0) {
        return '\0';
      }
    }
  }
  else if (mode == 0) {
    if ((((youmonst.data)->mflags1 & 0x60) == 0x20) &&
       (u.uz.dnum != dungeon_topology.d_sokoban_dnum)) {
      iVar16 = still_chewing(x_00,cVar15);
      if (iVar16 != 0) {
        return '\0';
      }
    }
    else {
      cVar4 = u.ux + (schar)local_a0;
      cVar15 = u.uy + (schar)local_98;
      iVar16 = (int)cVar4;
      iVar17 = (int)cVar15;
      poVar11 = sobj_at(0x214,level,iVar16,iVar17);
      if (poVar11 != (obj *)0x0) {
        local_50 = (long)iVar16;
        local_68 = (long)iVar17;
        local_6c = (int)local_a0 * 2;
        local_70 = (int)local_98 * 2;
        local_38 = local_50 * 0xa8;
        local_88 = &u.uz;
        local_40 = &dungeon_topology.d_air_level;
        local_48 = &dungeon_topology.d_rogue_level;
        do {
          if (poVar11 != *(obj **)((long)level->objects[0] + local_68 * 8 + local_38)) {
            movobj(poVar11,cVar4,cVar15);
          }
          x = u.ux + (char)local_6c;
          y = u.uy + (char)local_70;
          if (-1 < multi) {
            u._1052_1_ = u._1052_1_ & 0xef;
            u.usleep = 0;
            multi = 0;
            memset(multi_txt,0,0x100);
            flags.run = 0;
            flags.mv = '\0';
            iflags.travel1 = '\0';
            flags.travel = '\0';
          }
          if (((u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) ||
              ((youmonst.data)->mlet == '\x05')) ||
             (bVar3 = on_level(local_88,local_40), bVar3 != '\0')) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a48f7;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a48f2;
            }
            else {
LAB_001a48f2:
              if (ublindf != (obj *)0x0) {
LAB_001a48f7:
                if (ublindf->oartifact == '\x1d') goto LAB_001a490a;
              }
              feel_location(cVar4,cVar15);
            }
LAB_001a490a:
            pcVar18 = xname(poVar11);
            pcVar18 = the(pcVar18);
            pcVar13 = "You don\'t have enough leverage to push %s.";
            goto LAB_001a4921;
          }
          if (((youmonst.data)->msize == '\0') && (u.usteed == (monst *)0x0)) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a4a8d;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a4a88;
            }
            else {
LAB_001a4a88:
              if (ublindf != (obj *)0x0) {
LAB_001a4a8d:
                if (ublindf->oartifact == '\x1d') goto LAB_001a4aa0;
              }
              feel_location(cVar4,cVar15);
            }
LAB_001a4aa0:
            pcVar18 = xname(poVar11);
            pline("You\'re too small to push that %s.",pcVar18);
LAB_001a4f94:
            if (((youmonst.data)->mflags2 & 0x8000000) != 0) {
              if ((u.usteed != (monst *)0x0) && (u.weapon_skills[0x27].skill < '\x02')) {
                pcVar18 = "push aside";
                if (u.uz.dnum != dungeon_topology.d_sokoban_dnum && flags.pickup != '\0') {
                  pcVar18 = "pick up";
                }
                pcVar13 = xname(poVar11);
                pcVar13 = the(pcVar13);
                pcVar14 = y_monnam(u.usteed);
                pline("You aren\'t skilled enough to %s %s from %s.",pcVar18,pcVar13,pcVar14);
                return '\x01';
              }
              pcVar18 = "push it aside";
              if (u.uz.dnum != dungeon_topology.d_sokoban_dnum && flags.pickup != '\0') {
                pcVar18 = "pick it up";
              }
              pline("However, you can easily %s.",pcVar18);
              goto LAB_001a50e4;
            }
            if (u.usteed != (monst *)0x0) {
              return '\0';
            }
            if ((invent == (obj *)0x0) || (iVar16 = inv_weight(), iVar16 < -0x351)) {
              if (((schar)local_a0 != '\0' && (schar)local_98 != '\0') &&
                 (('\x10' < level->locations[u.ux][local_68].typ ||
                  ('\x10' < level->locations[local_50][u.uy].typ)))) goto LAB_001a502b;
            }
            else {
LAB_001a502b:
              if ((youmonst.data)->msize != '\0') {
                return '\0';
              }
            }
            pline("However, you can squeeze yourself into a small opening.");
LAB_001a50e4:
            if (u.uz.dnum != dungeon_topology.d_sokoban_dnum) {
              return '\x01';
            }
            sokoban_trickster();
            return '\x01';
          }
          if ((0x4e < (byte)(x - 1)) || (0x14 < y)) {
LAB_001a4890:
            if (u.usteed == (monst *)0x0) {
              pcVar18 = xname(poVar11);
              pcVar18 = the(pcVar18);
              pline("You try to move %s, but in vain.",pcVar18);
            }
            else {
              pcVar18 = y_monnam(u.usteed);
              pcVar18 = upstart(pcVar18);
              pcVar13 = xname(poVar11);
              pcVar13 = the(pcVar13);
              pline("%s tries to move %s, but cannot.",pcVar18,pcVar13);
            }
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
                if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_001a4f94;
                goto LAB_001a4984;
              }
LAB_001a4989:
              if (ublindf->oartifact == '\x1d') goto LAB_001a4f94;
            }
            else {
LAB_001a4984:
              if (ublindf != (obj *)0x0) goto LAB_001a4989;
            }
            feel_location(cVar4,cVar15);
            goto LAB_001a4f94;
          }
          local_90 = (ulong)y;
          local_80 = (char *)(local_90 * 3);
          cVar1 = level->locations[x][local_90].typ;
          if (((cVar1 < '\x11') || (cVar1 == '\x16')) ||
             (((((schar)local_98 != '\0' && ((schar)local_a0 != '\0')) && (cVar1 == '\x17')) &&
              ((bVar3 = on_level(local_88,local_48), bVar3 != '\0' ||
               ((*(ushort *)(&level->locations[x][0].field_0x6 + (long)local_80 * 4) & 0x1e0) != 0))
              )))) goto LAB_001a4890;
          iVar7 = (int)(char)x;
          iVar8 = (int)(char)y;
          poVar12 = sobj_at(0x214,level,iVar7,iVar8);
          if (poVar12 != (obj *)0x0) goto LAB_001a4890;
          ptVar10 = t_at(level,iVar7,iVar8);
          worm = level->monsters[x][local_90];
          if (worm == (monst *)0x0) {
            worm = (monst *)0x0;
          }
          else if ((worm->field_0x61 & 2) != 0) {
            worm = (monst *)0x0;
          }
          local_78 = ptVar10;
          if ((((schar)local_98 != '\0') && ((schar)local_a0 != '\0')) &&
             (u.uz.dnum == dungeon_topology.d_sokoban_dnum)) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a4ae8;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a4ae3;
            }
            else {
LAB_001a4ae3:
              if (ublindf != (obj *)0x0) {
LAB_001a4ae8:
                if (ublindf->oartifact == '\x1d') goto LAB_001a4afb;
              }
              feel_location(cVar4,cVar15);
            }
LAB_001a4afb:
            pcVar18 = xname(poVar11);
            pcVar18 = The(pcVar18);
            pcVar13 = surface(iVar16,iVar17);
            pline("%s won\'t roll diagonally on this %s.",pcVar18,pcVar13);
            goto LAB_001a4f94;
          }
          bVar3 = revive_nasty(iVar7,iVar8,"You sense movement on the other side.");
          if (bVar3 != '\0') {
            return '\0';
          }
          if ((worm != (monst *)0x0) && (worm->data->mlet != '6')) {
            if (((worm->field_0x62 & 0x80) != 0) &&
               ((ptVar10 != (trap *)0x0 &&
                (bVar5 = ptVar10->field_0x8, (byte)((bVar5 & 0x1f) - 0xb) < 2)))) goto LAB_001a415a;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a4be1;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a4bdc;
            }
            else {
LAB_001a4bdc:
              if (ublindf != (obj *)0x0) {
LAB_001a4be1:
                if (ublindf->oartifact == '\x1d') goto LAB_001a4bf4;
              }
              feel_location(cVar4,cVar15);
            }
LAB_001a4bf4:
            if (worm->wormno == '\0') {
              if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_001a4dd1;
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a4cef;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a4ce6;
              }
              else {
LAB_001a4ce6:
                if (ublindf == (obj *)0x0) goto LAB_001a4e1d;
LAB_001a4cef:
                if (ublindf->oartifact != '\x1d') goto LAB_001a4e1d;
              }
              if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                   (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                  ((viz_array[worm->my][worm->mx] & 1U) != 0)) &&
                 ((worm->data->mflags3 & 0x200) != 0)) goto LAB_001a4dd1;
LAB_001a4e1d:
              if (((worm->data->mflags1 & 0x10000) == 0) &&
                 ((poVar12 = which_armor(worm,4), poVar12 == (obj *)0x0 ||
                  (poVar12 = which_armor(worm,4), poVar12->otyp != 0x4f)))) {
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a4e6d;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a4e68;
                }
                else {
LAB_001a4e68:
                  if (ublindf != (obj *)0x0) {
LAB_001a4e6d:
                    if (ublindf->oartifact == '\x1d') goto LAB_001a4ef9;
                  }
                  if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                       (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                       youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0))
                  goto LAB_001a4f48;
                }
LAB_001a4ef9:
                if ((u.uprops[0x19].extrinsic != 0) &&
                   ((u.uprops[0x19].blocked == 0 &&
                    (iVar16 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), iVar16 < 0x41)
                    ))) goto LAB_001a4f48;
              }
              if ((u.uprops[0x42].intrinsic != 0) ||
                 ((u.uprops[0x42].extrinsic != 0 || (bVar3 = match_warn_of_mon(worm), bVar3 != '\0')
                  ))) goto LAB_001a4f48;
              pcVar18 = xname(poVar11);
              pcVar18 = the(pcVar18);
              You_hear("a monster behind %s.",pcVar18);
              map_invisible(x,y);
            }
            else {
              bVar3 = worm_known(level,worm);
              if (bVar3 == '\0') goto LAB_001a4e1d;
LAB_001a4dd1:
              uVar9 = *(uint *)&worm->field_0x60;
              if ((((uVar9 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
                 (u.uprops[0xc].extrinsic == 0)) {
                if (((uVar9 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                goto LAB_001a4e10;
                goto LAB_001a4e1d;
              }
              if ((uVar9 & 0x280) != 0) goto LAB_001a4e1d;
LAB_001a4e10:
              if ((u._1052_1_ & 0x20) != 0) goto LAB_001a4e1d;
LAB_001a4f48:
              pcVar18 = a_monnam(worm);
              pline("There\'s %s on the other side.",pcVar18);
            }
            if (flags.verbose != '\0') {
              if (u.usteed == (monst *)0x0) {
                pcVar18 = "you";
              }
              else {
                pcVar18 = y_monnam(u.usteed);
              }
              pline("Perhaps that\'s why %s cannot move it.",pcVar18);
            }
            goto LAB_001a4f94;
          }
          if (ptVar10 == (trap *)0x0) {
switchD_001a4179_caseD_7:
            bVar3 = closed_door(level,iVar7,iVar8);
            if (bVar3 != '\0') goto LAB_001a4890;
            bVar3 = boulder_hits_pool(poVar11,iVar7,iVar8,'\x01');
            if (bVar3 != '\0') goto LAB_001a474a;
            if (poVar11 != level->objlist) {
              remove_object(poVar11);
              place_object(poVar11,level,(int)poVar11->ox,(int)poVar11->oy);
            }
            if (u.usteed == (monst *)0x0) {
              if ((long)(ulong)moves < (long)moverock_lastmovetime ||
                  (long)(moverock_lastmovetime + 2) < (long)(ulong)moves) {
                pcVar18 = "little";
                if (((youmonst.data)->mflags2 >> 0x1b & 1) == 0) {
                  pcVar18 = "great";
                }
                pcVar13 = xname(poVar11);
                pcVar13 = the(pcVar13);
                pline("With %s effort you move %s.",pcVar18,pcVar13);
              }
              exercise(0,'\x01');
            }
            else {
              pcVar18 = y_monnam(u.usteed);
              pcVar18 = upstart(pcVar18);
              pcVar13 = xname(poVar11);
              pcVar13 = the(pcVar13);
              pline("%s moves %s.",pcVar18,pcVar13);
            }
            moverock_lastmovetime = (ulong)moves;
            if (((&level->locations[x][0].field_0x6)[(long)local_80 * 4] & 8) != 0) {
              unmap_object(iVar7,iVar8);
            }
            movobj(poVar11,x,y);
            iVar7 = iVar16;
            iVar8 = iVar17;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
                if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_001a4745;
                goto LAB_001a46fa;
              }
LAB_001a46ff:
              if (ublindf->oartifact == '\x1d') goto LAB_001a4745;
            }
            else {
LAB_001a46fa:
              if (ublindf != (obj *)0x0) goto LAB_001a46ff;
            }
            feel_location(x,y);
            feel_location(cVar4,cVar15);
          }
          else {
            bVar5 = ptVar10->field_0x8;
LAB_001a415a:
            switch(bVar5 & 0x1f) {
            case 6:
              uVar9 = mt_random();
              if ((uVar9 * -0x33333333 >> 1 | (uint)((uVar9 * -0x33333333 & 1) != 0) << 0x1f) <
                  0x1999999a) goto switchD_001a4179_caseD_7;
              obj_extract_self(poVar11);
              place_object(poVar11,level,iVar7,iVar8);
              unblock_point(iVar16,iVar17);
              newsym(iVar16,iVar17);
              pcVar18 = Tobjnam(poVar11,"trigger");
              ptVar10 = local_78;
              pcVar13 = "your";
              if (-1 < (char)local_78->field_0x8) {
                pcVar13 = "a";
              }
              pline("KAABLAMM!!!  %s %s land mine.",pcVar18,pcVar13);
              blow_up_landmine(ptVar10);
              fill_pit(level,(int)u.ux,(int)u.uy);
              break;
            default:
              goto switchD_001a4179_caseD_7;
            case 0xb:
            case 0xc:
              obj_extract_self(poVar11);
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a41a8;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a419f;
LAB_001a43f0:
                viz_array[local_90][x] = viz_array[local_90][x] | 2;
              }
              else {
LAB_001a419f:
                if (ublindf != (obj *)0x0) {
LAB_001a41a8:
                  if (ublindf->oartifact == '\x1d') goto LAB_001a43f0;
                }
              }
              bVar3 = flooreffects(poVar11,iVar7,iVar8,"fall");
              if (bVar3 == '\0') {
                place_object(poVar11,level,iVar7,iVar8);
              }
              if (worm == (monst *)0x0) goto LAB_001a474a;
              if (u.uprops[0x1e].intrinsic != 0) {
LAB_001a4456:
                if (ublindf != (obj *)0x0) {
LAB_001a445f:
                  if (ublindf->oartifact == '\x1d') goto LAB_001a4745;
                }
                goto LAB_001a474a;
              }
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a445f;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a4456;
              goto LAB_001a4745;
            case 0xd:
            case 0xe:
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001a4221;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001a421c;
LAB_001a453c:
                pcVar18 = "fall";
                if ((bVar5 & 0x1f) == 0xe) {
                  pcVar18 = "trigger";
                }
                local_80 = Tobjnam(poVar11,pcVar18);
                local_58 = " into";
                if ((ptVar10->field_0x8 & 0x1f) == 0xe) {
                  local_58 = "";
                }
                local_60 = otense(poVar11,"plug");
                pcVar18 = "plugs a hole";
                if ((ptVar10->field_0x8 & 0x1f) == 0xe) {
                  pcVar18 = "plugs a trap door";
                }
                pcVar13 = surface(iVar7,iVar8);
                pline("%s%s and %s a %s in the %s!",local_80,local_58,local_60,pcVar18 + 8,pcVar13);
                ptVar10 = local_78;
              }
              else {
LAB_001a421c:
                if (ublindf != (obj *)0x0) {
LAB_001a4221:
                  if (ublindf->oartifact == '\x1d') goto LAB_001a453c;
                }
                pcVar18 = xname(poVar11);
                pcVar18 = the(pcVar18);
                pline("Kerplunk!  You no longer feel %s.",pcVar18);
              }
              deltrap(level,ptVar10);
              delobj(poVar11);
              bury_objs(iVar7,iVar8);
              break;
            case 0x10:
            case 0x11:
              if (u.usteed == (monst *)0x0) {
                pcVar18 = xname(poVar11);
                pcVar18 = the(pcVar18);
                pline("You push %s and suddenly it disappears!",pcVar18);
              }
              else {
                pcVar18 = y_monnam(u.usteed);
                pcVar18 = upstart(pcVar18);
                pcVar13 = xname(poVar11);
                pcVar13 = the(pcVar13);
                pline("%s pushes %s and suddenly it disappears!",pcVar18,pcVar13);
              }
              if ((ptVar10->field_0x8 & 0x1f) == 0x10) {
                rloco(poVar11);
              }
              else {
                iVar7 = random_teleport_level();
                sVar6 = depth(local_88);
                if ((iVar7 == sVar6) || (u.uz.dnum == dungeon_topology.d_astral_level.dnum))
                goto LAB_001a474a;
                obj_extract_self(poVar11);
                get_level(&local_a2,iVar7);
                deliver_object(poVar11,local_a2.dnum,local_a2.dlevel,0);
                ptVar10 = local_78;
              }
              seetrap(ptVar10);
              goto LAB_001a474a;
            }
            if ((viz_array[local_90][x] & 2U) != 0) {
LAB_001a4745:
              newsym(iVar7,iVar8);
            }
          }
LAB_001a474a:
          poVar11 = sobj_at(0x214,level,iVar16,iVar17);
        } while (poVar11 != (obj *)0x0);
      }
    }
  }
  return '\x01';
}

Assistant:

boolean test_move(int ux, int uy, int dx, int dy, int dz, int mode)
{
    int x = ux+dx;
    int y = uy+dy;
    struct rm *tmpr = &level->locations[x][y];
    struct rm *ust;

    /*
     *  Check for physical obstacles.  First, the place we are going.
     */
    if (IS_ROCK(tmpr->typ) || tmpr->typ == IRONBARS) {
	if (Blind && mode == DO_MOVE) feel_location(x,y);
	if (Passes_walls && may_passwall(level, x,y)) {
	    ;	/* do nothing */
	} else if (tmpr->typ == IRONBARS) {
	    /* Eat the bars if you can. */
	    if ((mode == DO_MOVE && !flags.nopick &&
		 metallivorous(youmonst.data) && still_chewing(x, y)) ||
		!(Passes_walls || passes_bars(youmonst.data)))
		return FALSE;
	} else if (tunnels(youmonst.data) && !needspick(youmonst.data)) {
	    /* Eat the rock. */
	    if (mode == DO_MOVE && still_chewing(x,y)) return FALSE;
	} else if (flags.autodig && !flags.run && !flags.nopick &&
		   uwep && is_pick(uwep)) {
	    /* MRKR: Automatic digging when wielding the appropriate tool */
	    if (mode == DO_MOVE)
		use_pick_axe2(uwep, dx, dy, dz);
	    return FALSE;
	} else {
	    if (mode == DO_MOVE) {
		if (Is_stronghold(&u.uz) && is_db_wall(x,y))
		    pline("The drawbridge is up!");
		if (Passes_walls && !may_passwall(level, x,y) && In_sokoban(&u.uz))
		    pline("The Sokoban walls resist your ability.");
	    }
	    return FALSE;
	}
    } else if (IS_DOOR(tmpr->typ)) {
	if (closed_door(level, x,y)) {
	    if (Blind && mode == DO_MOVE) feel_location(x,y);
	    /* ALI - artifact doors */
	    if (artifact_door(level, x, y)) {
		if (mode == DO_MOVE) {
		    if (amorphous(youmonst.data)) {
			pline("You try to ooze under the door, "
			      "but the gap is too small.");
		    } else if (tunnels(youmonst.data) && !needspick(youmonst.data)) {
			pline("You hurt your teeth on the reinforced door.");
		    } else if (x == ux || y == uy) {
			if (Blind || Stunned || ACURR(A_DEX) < 10 || Fumbling) {
			    pline("Ouch!  You bump into a heavy door.");
			    exercise(A_DEX, FALSE);
			} else {
			    pline("That door is closed.");
			}
		    }
		}
		return FALSE;
	    } else if (Passes_walls)
		;	/* do nothing */
	    else if (can_ooze(&youmonst)) {
		if (mode == DO_MOVE) pline("You ooze under the door.");
	    } else if (tunnels(youmonst.data) && !needspick(youmonst.data)) {
		/* Eat the door. */
		if (mode == DO_MOVE && still_chewing(x,y)) return FALSE;
	    } else {
		if (mode == DO_MOVE) {
		    if (amorphous(youmonst.data))
			pline("You try to ooze under the door, but can't squeeze your possessions through.");
		    else if (x == ux || y == uy) {
			if (Blind || Stunned || ACURR(A_DEX) < 10 || Fumbling) {
			    if (u.usteed) {
				pline("You can't lead %s through that closed door.",
				         y_monnam(u.usteed));
			    } else {
			        pline("Ouch!  You bump into a door.");
			        exercise(A_DEX, FALSE);
			    }
			} else pline("That door is closed.");
		    }
		} else if (mode == TEST_TRAV || mode == TEST_TRAP) goto testdiag;
		return FALSE;
	    }
	} else {
	testdiag:
	    if (dx && dy && !Passes_walls
		&& ((tmpr->doormask & ~D_BROKEN)
		    || Is_rogue_level(&u.uz)
		    || block_door(x,y))) {
		/* Diagonal moves into a door are not allowed. */
		if (Blind && mode == DO_MOVE)
		    feel_location(x,y);
		return FALSE;
	    }
	}
    }
    if (dx && dy
	    && bad_rock(youmonst.data, TRUE, ux,y)
	    && bad_rock(youmonst.data, TRUE, x,uy)) {
	/* Move at a diagonal. */
	if (In_sokoban(&u.uz)) {
	    if (mode == DO_MOVE)
		pline("You cannot pass that way.");
	    return FALSE;
	}
	if (bigmonst(youmonst.data)) {
	    if (mode == DO_MOVE)
		pline("Your body is too large to fit through.");
	    return FALSE;
	}
	if (invent && (inv_weight() + weight_cap() > 600)) {
	    if (mode == DO_MOVE)
		pline("You are carrying too much to get through.");
	    return FALSE;
	}
    }
    /* Pick travel path that does not require crossing a trap.
     * Avoid water and lava using the usual running rules.
     * (but not u.ux/u.uy because findtravelpath walks toward u.ux/u.uy) */
    if (flags.run == 8 && (x != u.ux || y != u.uy)) {
	struct trap* t = t_at(level, x, y);

	if ((t && t->tseen) ||
	    (!Levitation && !Flying &&
	     !is_clinger(youmonst.data) &&
	     (is_pool(level, x, y) || is_lava(level, x, y) || is_swamp(level, x, y)) &&
	     level->locations[x][y].seenv)) {
	    if (mode == DO_MOVE) {
		if (is_pool(level, x, y)) autoexplore_msg("a body of water");
		else if (is_lava(level, x, y)) autoexplore_msg("a pool of lava");
		else if (is_swamp(level, x, y)) autoexplore_msg("a muddy swamp");
		if (flags.travel) return FALSE;
	    }
	    return mode == TEST_TRAP || mode == DO_MOVE;
	}
    }

    if (mode == TEST_TRAP) return FALSE; /* not a move through a trap */

    ust = &level->locations[ux][uy];

    /* Now see if other things block our way . . */
    if (dx && dy && !Passes_walls
		     && (IS_DOOR(ust->typ) && ((ust->doormask & ~D_BROKEN)
			     || Is_rogue_level(&u.uz)
			     || block_entry(x, y))
			 )) {
	/* Can't move at a diagonal out of a doorway with door. */
	if (mode == DO_MOVE)
	    autoexplore_msg("the doorway");
	return FALSE;
    }

    if (sobj_at(BOULDER, level, x, y) && (In_sokoban(&u.uz) || !Passes_walls)) {
	if (!(Blind || Hallucination) && (flags.run >= 2) && mode != TEST_TRAV) {
	    if (sobj_at(BOULDER, level, x, y) && mode == DO_MOVE)
		autoexplore_msg("a boulder");
	    return FALSE;
	}
	if (mode == DO_MOVE) {
	    /* tunneling monsters will chew before pushing */
	    if (tunnels(youmonst.data) && !needspick(youmonst.data) &&
		!In_sokoban(&u.uz)) {
		if (still_chewing(x,y)) return FALSE;
	    } else
		if (moverock(dx, dy) < 0) return FALSE;
	} else if (mode == TEST_TRAV) {
	    struct obj* obj;

	    /* never travel through boulders in Sokoban */
	    if (In_sokoban(&u.uz)) return FALSE;

	    /* don't pick two boulders in a row, unless there's a way thru */
	    if (sobj_at(BOULDER, level, ux,uy) && !In_sokoban(&u.uz)) {
		if (!Passes_walls &&
		    !(tunnels(youmonst.data) && !needspick(youmonst.data)) &&
		    !carrying(PICK_AXE) && !carrying(DWARVISH_MATTOCK) &&
		    !((obj = carrying(WAN_DIGGING)) &&
		      !objects[obj->otyp].oc_name_known))
		    return FALSE;
	    }
	}
	/* assume you'll be able to push it when you get there... */
    }

    /* OK, it is a legal place to move. */
    return TRUE;
}